

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall Query::Query(Query *this,QString *qstr)

{
  undefined4 *in_RDI;
  vector<QToken,_std::allocator<QToken>_> *in_stack_ffffffffffffffc8;
  
  *in_RDI = 1;
  std::vector<QToken,_std::allocator<QToken>_>::vector
            ((vector<QToken,_std::allocator<QToken>_> *)(in_RDI + 2),in_stack_ffffffffffffffc8);
  PrimitiveQuery::PrimitiveQuery((PrimitiveQuery *)(in_RDI + 8),GRAM3,0);
  in_RDI[10] = 0;
  std::vector<Query,_std::allocator<Query>_>::vector
            ((vector<Query,_std::allocator<Query>_> *)0x1b83bd);
  return;
}

Assistant:

Query::Query(QString &&qstr)
    : type(QueryType::PRIMITIVE), count(0), value(std::move(qstr)) {}